

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headlossmodel.cpp
# Opt level: O0

void __thiscall
HW_HeadLossModel::findHeadLoss
          (HW_HeadLossModel *this,Pipe *pipe,double flow,double *headLoss,double *gradient)

{
  double dVar1;
  double dVar2;
  double __x;
  double dVar3;
  double k;
  double r;
  double q;
  double *gradient_local;
  double *headLoss_local;
  double flow_local;
  Pipe *pipe_local;
  HW_HeadLossModel *this_local;
  
  std::abs((int)this);
  dVar1 = pipe->resistance;
  dVar2 = pipe->lossFactor;
  dVar3 = pow(__x,0.8520000000000001);
  *gradient = dVar1 * 1.852 * dVar3;
  if (1e-06 < *gradient || *gradient == 1e-06) {
    *headLoss = (__x * *gradient) / 1.852;
  }
  else {
    *gradient = 1e-06;
    *headLoss = __x * *gradient;
  }
  if (0.0 < dVar2) {
    *headLoss = dVar2 * __x * __x + *headLoss;
    *gradient = dVar2 * 2.0 * __x + *gradient;
  }
  if (flow < 0.0) {
    *headLoss = -*headLoss;
  }
  return;
}

Assistant:

void HW_HeadLossModel::findHeadLoss(Pipe* pipe, double flow, double& headLoss,
    double& gradient)
{
    double q = abs(flow);
    double r = pipe->resistance;
    double k = pipe->lossFactor;

    gradient = HW_EXP * r * pow(q, HW_EXP-1.0);
    if ( gradient < MIN_GRADIENT )
    {
        gradient = MIN_GRADIENT;
        headLoss = q * gradient;
    }
    else headLoss = q * gradient / HW_EXP;
    if (k > 0.0)
    {
        headLoss += k * q * q;
        gradient += 2.0 * k * q;
   	}

    // ... give proper sign to head loss

    if (flow < 0.0) headLoss = -headLoss;
}